

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O0

X * __thiscall IMLE::predictStrongest(IMLE *this,Z *z)

{
  reference pdVar1;
  reference pMVar2;
  IMLE *in_RSI;
  long in_RDI;
  int i;
  int best;
  Scal w;
  undefined4 local_20;
  undefined4 local_1c;
  Z *in_stack_ffffffffffffffe8;
  double dVar3;
  
  predictMultiple(in_RSI,in_stack_ffffffffffffffe8);
  dVar3 = 0.0;
  local_1c = 0;
  for (local_20 = 0; local_20 < *(int *)(in_RDI + 0x284); local_20 = local_20 + 1) {
    pdVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x208),(long)local_20);
    if (dVar3 < *pdVar1) {
      pdVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x208),(long)local_20
                         );
      dVar3 = *pdVar1;
      local_1c = local_20;
    }
  }
  *(int *)(in_RDI + 0x280) = local_1c;
  pMVar2 = std::
           vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
           ::operator[]((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                         *)(in_RDI + 0x1d8),(long)*(int *)(in_RDI + 0x280));
  return pMVar2;
}

Assistant:

IMLE_CLASS_TEMPLATE
IMLE_TYPENAME IMLE_base::X const &IMLE_base::predictStrongest(Z const &z)
{
    predictMultiple(z);

    Scal w = 0.0;
    int best = 0;
    for(int i=0; i < nSolFound; i++)
        if( predictionsWeight[i] > w )
        {
            w = predictionsWeight[i];
            best = i;
        }

    solIdx = best;

    //          Not needed, already in predict()
    // hasPredJacobian = false;
    // hasPredErrorReductionDrvt = false;

    return predictions[solIdx];
}